

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O0

void anon_unknown.dwarf_3336::Test_TemplateTestUtilTest_GetSectionValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  char *__s2;
  TemplateString local_110;
  TemplateDictionaryPeer local_f0;
  TemplateDictionaryPeer peer;
  size_t sStack_e0;
  undefined8 local_d8;
  TemplateId TStack_d0;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"test_GetSectionValue");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"VALUE");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"value");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar2.length_ = sStack_e0;
  TVar2.ptr_ = (char *)peer.dict_;
  TVar2._16_8_ = local_d8;
  TVar2.id_ = TStack_d0;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_f0,local_78);
  ctemplate::TemplateString::TemplateString(&local_110,"VALUE");
  __s2 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_f0,&local_110);
  iVar3 = strcmp("value",__s2);
  if (iVar3 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","strcmp(\"value\", peer.GetSectionValue(\"VALUE\")) == 0");
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, GetSectionValue) {
  TemplateDictionary dict("test_GetSectionValue");
  dict.SetValue("VALUE", "value");

  TemplateDictionaryPeer peer(&dict);
  EXPECT_STREQ("value", peer.GetSectionValue("VALUE"));
}